

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

string * JSON::Writer::encode_string(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  size_type sVar4;
  pointer pcVar5;
  byte *pbVar6;
  bool bVar7;
  
  pbVar3 = (byte *)(str->_M_dataplus)._M_p;
  sVar4 = str->_M_string_length;
  pbVar6 = pbVar3;
  do {
    if (pbVar6 == pbVar3 + sVar4) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = (str->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar5,pcVar5 + str->_M_string_length);
      return __return_storage_ptr__;
    }
    bVar1 = *pbVar6;
    bVar7 = (bVar1 & 0xfe) != 0x20;
    if (bVar7 && (bVar1 == 0x5c || bVar1 < 0x23)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)__return_storage_ptr__,pbVar3,pbVar6);
      do {
        bVar2 = *pbVar6;
        if ((bVar2 & 0xfe) == 0x20 || 0x22 < bVar2 && bVar2 != 0x5c) {
LAB_00121640:
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          switch(bVar2) {
          case 8:
            break;
          case 9:
            break;
          case 10:
            break;
          case 0xb:
code_r0x0012169f:
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            goto LAB_00121640;
          case 0xc:
            break;
          case 0xd:
            break;
          default:
            if ((bVar2 != 0x5c) && (bVar2 != 0x22)) goto code_r0x0012169f;
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar3 + sVar4);
    }
    else {
      pbVar6 = pbVar6 + 1;
    }
    if (bVar7 && (bVar1 == 0x5c || bVar1 < 0x23)) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string
JSON::Writer::encode_string(std::string const& str)
{
    static auto constexpr hexchars = "0123456789abcdef";

    auto begin = str.cbegin();
    auto end = str.cend();
    auto iter = begin;
    while (iter != end) {
        auto c = static_cast<unsigned char>(*iter);
        if ((c > 34 && c != '\\') || c == ' ' || c == 33) {
            // Optimistically check that no char in str requires escaping. Hopefully we can just
            // return the input str.
            ++iter;
        } else {
            // We found a char that requires escaping. Initialize result to the chars scanned so
            // far, append/replace the rest of str one char at a time, and return the result.
            std::string result{begin, iter};

            for (; iter != end; ++iter) {
                auto ch = static_cast<unsigned char>(*iter);
                if ((ch > 34 && ch != '\\') || ch == ' ' || ch == 33) {
                    // Check for most common case first.
                    result += *iter;
                } else {
                    switch (ch) {
                    case '\\':
                        result += "\\\\";
                        break;
                    case '\"':
                        result += "\\\"";
                        break;
                    case '\b':
                        result += "\\b";
                        break;
                    case '\f':
                        result += "\\f";
                        break;
                    case '\n':
                        result += "\\n";
                        break;
                    case '\r':
                        result += "\\r";
                        break;
                    case '\t':
                        result += "\\t";
                        break;
                    default:
                        result += ch < 16 ? "\\u000" : "\\u001";
                        result += hexchars[ch % 16];
                    }
                }
            }
            return result;
        }
    }
    return str;
}